

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O3

void __thiscall test_b_tree::test_basic_remove(test_b_tree *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int64_t *piVar2;
  runtime_error *prVar3;
  long lVar4;
  uint uVar5;
  int64_t *piVar6;
  undefined8 *puVar7;
  string *psVar8;
  byte bVar9;
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  optional<long> oVar10;
  b_tree t;
  allocator_type local_e1;
  vector<long,_std::allocator<long>_> local_e0;
  string local_c8 [2];
  b_tree local_78;
  
  bVar9 = 0;
  paVar1 = &local_78._p._fileName.field_2;
  local_78._p._fileName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"test_basic_remove.db","");
  b_tree::create_db_file((string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._p._fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._p._fileName._M_dataplus._M_p,
                    local_78._p._fileName.field_2._M_allocated_capacity + 1);
  }
  local_c8[0]._M_dataplus._M_p = (pointer)&local_c8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"test_basic_remove.db","");
  b_tree::b_tree(&local_78,local_c8,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8[0]._M_dataplus._M_p != &local_c8[0].field_2) {
    operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
  }
  puVar7 = &DAT_0010a578;
  psVar8 = local_c8;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (psVar8->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    psVar8 = (string *)((long)psVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  __l._M_len = 10;
  __l._M_array = (iterator)local_c8;
  std::vector<long,_std::allocator<long>_>::vector(&local_e0,__l,&local_e1);
  insert_all<b_tree>(&local_78,&local_e0);
  if (local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (int64_t *)0x0) {
    operator_delete(local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  b_tree::remove(&local_78,(char *)0x1e);
  oVar10 = b_tree::search(&local_78,0x1e);
  if (((undefined1  [16])
       oVar10.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    rtf_format_abi_cxx11_
              (local_c8,"%s at Line:%d File:%s","!t.search(30)",0x71,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
              );
    std::runtime_error::runtime_error(prVar3,(string *)local_c8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar7 = &DAT_0010a5c8;
  psVar8 = local_c8;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    (psVar8->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    psVar8 = (string *)((long)psVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  __l_00._M_len = 9;
  __l_00._M_array = (iterator)local_c8;
  std::vector<long,_std::allocator<long>_>::vector(&local_e0,__l_00,&local_e1);
  if (local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar5 = 1;
  }
  else {
    piVar2 = local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar6 = piVar2 + 1;
      oVar10 = b_tree::search(&local_78,*piVar2);
      uVar5 = oVar10.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._8_4_;
      if (((undefined1  [16])
           oVar10.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      break;
      piVar2 = piVar6;
    } while (piVar6 != local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (int64_t *)0x0) {
    operator_delete(local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((uVar5 & 1) == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    rtf_format_abi_cxx11_
              (local_c8,"%s at Line:%d File:%s",
               "has_all_keys(t, {10, 20, 40, 50, 60, 70, 80, 90, 100})",0x72,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
              );
    std::runtime_error::runtime_error(prVar3,(string *)local_c8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  unlink("test_basic_remove.db");
  pager::~pager(&local_78._p);
  return;
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}